

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O0

Memslot __thiscall bsplib::Rdma::lookup_reg(Rdma *this,void *addr,bool pushed,bool popped)

{
  int pid;
  uint uVar1;
  Memslot MVar2;
  bool bVar3;
  Memslot MVar4;
  Memblock *pMVar5;
  reference puVar6;
  undefined1 local_50 [4];
  uint status;
  RRSIt j;
  void *local_38;
  _Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_30;
  const_iterator i;
  bool popped_local;
  bool pushed_local;
  void *addr_local;
  Rdma *this_local;
  
  i.
  super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  ._M_cur._6_1_ = popped;
  i.
  super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  ._M_cur._7_1_ = pushed;
  if (addr == (void *)0x0) {
    this_local = (Rdma *)null_slot();
  }
  else {
    MVar2 = this->m_cached_slot;
    MVar4 = no_slot();
    if (((MVar2 == MVar4) ||
        (pMVar5 = slot(this,this->m_pid,this->m_cached_slot), pMVar5->addr != addr)) ||
       (pMVar5 = slot(this,this->m_pid,this->m_cached_slot), pMVar5->status != 0)) {
      local_38 = addr;
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_map<void_*,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::find(&this->m_register,&stack0xffffffffffffffc8);
      j.current._M_node =
           (_List_const_iterator<unsigned_long>)
           std::
           unordered_map<void_*,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::end(&this->m_register);
      bVar3 = std::__detail::operator!=
                        (&local_30,
                         (_Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                          *)&j);
      if (bVar3) {
        std::__detail::
        _Node_const_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
        ::operator->((_Node_const_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                      *)&local_30);
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::rbegin
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
        while( true ) {
          std::__detail::
          _Node_const_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
          ::operator->((_Node_const_iterator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                        *)&local_30);
          std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::rend
                    ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
          bVar3 = std::operator!=((reverse_iterator<std::_List_const_iterator<unsigned_long>_> *)
                                  &stack0xffffffffffffffb8,
                                  (reverse_iterator<std::_List_const_iterator<unsigned_long>_> *)
                                  local_50);
          if (!bVar3) break;
          pid = this->m_pid;
          puVar6 = std::reverse_iterator<std::_List_const_iterator<unsigned_long>_>::operator*
                             ((reverse_iterator<std::_List_const_iterator<unsigned_long>_> *)
                              &stack0xffffffffffffffb8);
          pMVar5 = slot(this,pid,*puVar6);
          uVar1 = pMVar5->status;
          if (uVar1 == 0) {
            puVar6 = std::reverse_iterator<std::_List_const_iterator<unsigned_long>_>::operator*
                               ((reverse_iterator<std::_List_const_iterator<unsigned_long>_> *)
                                &stack0xffffffffffffffb8);
            this->m_cached_slot = *puVar6;
            return this->m_cached_slot;
          }
          if (((bool)(i.
                      super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                      ._M_cur._7_1_ & 1) == ((uVar1 & 1) != 0)) &&
             ((bool)(i.
                     super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                     ._M_cur._6_1_ & 1) == ((uVar1 & 2) != 0))) {
            puVar6 = std::reverse_iterator<std::_List_const_iterator<unsigned_long>_>::operator*
                               ((reverse_iterator<std::_List_const_iterator<unsigned_long>_> *)
                                &stack0xffffffffffffffb8);
            return *puVar6;
          }
          std::reverse_iterator<std::_List_const_iterator<unsigned_long>_>::operator++
                    ((reverse_iterator<std::_List_const_iterator<unsigned_long>_> *)
                     &stack0xffffffffffffffb8);
        }
      }
      this_local = (Rdma *)no_slot();
    }
    else {
      this_local = (Rdma *)this->m_cached_slot;
    }
  }
  return (Memslot)this_local;
}

Assistant:

Memslot lookup_reg( const void * addr, bool pushed, bool popped ) const
    {   
        if (addr == NULL ) return null_slot();
        
        if ( m_cached_slot != no_slot() 
                && slot( m_pid, m_cached_slot).addr == addr
                && slot( m_pid, m_cached_slot).status == Memblock::NORMAL )
            return m_cached_slot;

        Reg::const_iterator i = m_register.find( const_cast<void*>(addr) );
        if (i != m_register.end()) {
            for (RRSIt j = i->second.rbegin(); j != i->second.rend(); ++j) {
                unsigned status  = slot( m_pid, *j ).status ;
                if ( status == unsigned(Memblock::NORMAL))  {
                    m_cached_slot = *j;
                    return m_cached_slot;
                }
                if ( pushed == bool (status & Memblock::PUSHED)
                  &&  popped == bool (status & Memblock::POPPED)) {
                    return *j;
                }
                             
            }
        }
        return no_slot(); 
    }